

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.cpp
# Opt level: O2

void __thiscall luna::ModuleManager::LoadModule(ModuleManager *this,string *module_name)

{
  State *this_00;
  Value *pVVar1;
  String *module;
  OpenFileFail *this_01;
  InStream is;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  Value value;
  Value key;
  Lexer lexer;
  
  io::text::InStream::InStream(&is,module_name);
  if (is.stream_ != (FILE *)0x0) {
    this_00 = this->state_;
    module = State::GetString(this_00,module_name);
    local_c8._8_8_ = 0;
    local_b0 = std::
               _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/ModuleManager.cpp:38:21)>
               ::_M_invoke;
    local_b8 = std::
               _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/ModuleManager.cpp:38:21)>
               ::_M_manager;
    local_c8._M_unused._M_object = &is;
    Lexer::Lexer(&lexer,this_00,module,(CharInStream *)&local_c8);
    std::_Function_base::~_Function_base((_Function_base *)&local_c8);
    Load(this,&lexer);
    key.field_0.str_ = State::GetString(this->state_,module_name);
    key.type_ = ValueT_String;
    pVVar1 = (this->state_->stack_).top_;
    value.field_0 = pVVar1[-1].field_0;
    value.type_ = pVVar1[-1].type_;
    value._12_4_ = *(undefined4 *)&pVVar1[-1].field_0xc;
    Table::SetValue(this->modules_,&key,&value);
    Lexer::~Lexer(&lexer);
    io::text::InStream::~InStream(&is);
    return;
  }
  this_01 = (OpenFileFail *)__cxa_allocate_exception(0x20);
  OpenFileFail::OpenFileFail(this_01,module_name);
  __cxa_throw(this_01,&OpenFileFail::typeinfo,Exception::~Exception);
}

Assistant:

void ModuleManager::LoadModule(const std::string &module_name)
    {
        io::text::InStream is(module_name);
        if (!is.IsOpen())
            throw OpenFileFail(module_name);

        Lexer lexer(state_, state_->GetString(module_name),
                    [&is] () { return is.GetChar(); });
        Load(lexer);

        // Add to modules' table
        Value key(state_->GetString(module_name));
        Value value = *(state_->stack_.top_ - 1);
        modules_->SetValue(key, value);
    }